

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O2

void __thiscall Meter::paintEvent(Meter *this,QPaintEvent *param_1)

{
  QPainter p;
  DrawParams params;
  
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)&p,true);
  QPainter::translate(&p,1.0,1.0);
  params.rect.w = 0.0;
  params.rect.h = 0.0;
  params.rect.xp = 0.0;
  params.rect.yp = 0.0;
  MeterPrivate::drawBackground((this->d).d,&p,&params);
  MeterPrivate::drawRanges((this->d).d,&p,&params);
  MeterPrivate::drawScale((this->d).d,&p,&params);
  MeterPrivate::drawLabels((this->d).d,&p,&params);
  MeterPrivate::drawNeedle((this->d).d,&p,&params);
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void
Meter::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.translate( 1.0, 1.0 );

	MeterPrivate::DrawParams params;

	d->drawBackground( p, params );
	d->drawRanges( p, params );
	d->drawScale( p, params );
	d->drawLabels( p, params );
	d->drawNeedle( p, params );
}